

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

Opnd * __thiscall IR::Instr::SetDst(Instr *this,Opnd *newDst)

{
  Func *func;
  _func_int **pp_Var1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  byte bVar5;
  uint uVar6;
  undefined4 *puVar7;
  uint uVar8;
  char *message;
  char *error;
  uint lineNumber;
  
  if (newDst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x895,"(newDst != nullptr)","Calling SetDst with a NULL dst");
    if (!bVar3) goto LAB_004b2f9f;
    *puVar7 = 0;
  }
  if (this->m_dst != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x896,"(this->m_dst == nullptr)",
                       "Calling SetDst without unlinking/freeing the current dst");
    if (!bVar3) goto LAB_004b2f9f;
    *puVar7 = 0;
  }
  OVar4 = Opnd::GetKind(newDst);
  if (OVar4 == OpndKindReg) {
    OVar4 = Opnd::GetKind(newDst);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_004b2f9f;
      *puVar7 = 0;
    }
    if (((ushort)newDst[1].m_valueType.field_0 & 0x40) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x897,
                         "(!(newDst->IsRegOpnd() && newDst->AsRegOpnd()->IsSymValueFrozen()))",
                         "!(newDst->IsRegOpnd() && newDst->AsRegOpnd()->IsSymValueFrozen())");
      if (!bVar3) goto LAB_004b2f9f;
      *puVar7 = 0;
    }
  }
  func = this->m_func;
  if (newDst->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) goto LAB_004b2f9f;
    *puVar7 = 0;
  }
  bVar5 = newDst->field_0xb;
  if ((bVar5 & 2) != 0) {
    newDst = Opnd::Copy(newDst,func);
    bVar5 = newDst->field_0xb;
  }
  newDst->field_0xb = bVar5 | 2;
  this->m_dst = newDst;
  OVar4 = Opnd::GetKind(newDst);
  if (OVar4 == OpndKindReg) {
    OVar4 = Opnd::GetKind(newDst);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_004b2f9f;
      *puVar7 = 0;
    }
    if (newDst[1]._vptr_Opnd == (_func_int **)0x0) goto LAB_004b2d50;
    OVar4 = Opnd::GetKind(newDst);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      error = "(this->IsRegOpnd())";
      message = "Bad call to AsRegOpnd()";
      lineNumber = 0x79;
      goto LAB_004b2e1c;
    }
  }
  else {
LAB_004b2d50:
    OVar4 = Opnd::GetKind(newDst);
    if (OVar4 != OpndKindSym) {
      return newDst;
    }
    OVar4 = Opnd::GetKind(newDst);
    if (OVar4 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar3) goto LAB_004b2f9f;
      *puVar7 = 0;
    }
    if (*(char *)((long)newDst[1]._vptr_Opnd + 0x14) != '\x01') {
      return newDst;
    }
    OVar4 = Opnd::GetKind(newDst);
    if (OVar4 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      error = "(this->IsSymOpnd())";
      message = "Bad call to AsSymOpnd()";
      lineNumber = 0x45;
LAB_004b2e1c:
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,lineNumber,error,message);
      if (!bVar3) goto LAB_004b2f9f;
      *puVar7 = 0;
    }
  }
  pp_Var1 = newDst[1]._vptr_Opnd;
  if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar3) goto LAB_004b2f9f;
    *puVar7 = 0;
  }
  uVar6 = *(uint *)(pp_Var1 + 3);
  if ((uVar6 & 1) != 0) {
    if (pp_Var1[5] == (_func_int *)0x0) {
      pp_Var1[5] = (_func_int *)this;
      return newDst;
    }
    uVar8 = uVar6 & 0x100000;
    if ((uVar8 != 0) && (*(short *)((long)pp_Var1 + 0x16) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
      if (!bVar3) goto LAB_004b2f9f;
      *puVar7 = 0;
      uVar6 = *(uint *)(pp_Var1 + 3);
      uVar8 = uVar6 & 0x100000;
    }
    if (uVar8 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x8b1,"(!stackSym->IsArgSlotSym())",
                         "Arg Slot sym needs to be single def to maintain the StartCall arg links");
      if (!bVar3) {
LAB_004b2f9f:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
      uVar6 = *(uint *)(pp_Var1 + 3);
    }
    pp_Var1[5] = (_func_int *)0x0;
    *(uint *)(pp_Var1 + 3) = uVar6 & 0xfffff244;
  }
  return newDst;
}

Assistant:

Opnd *
Instr::SetDst(Opnd * newDst)
{
    AssertMsg(newDst != nullptr, "Calling SetDst with a NULL dst");
    AssertMsg(this->m_dst == nullptr, "Calling SetDst without unlinking/freeing the current dst");
    Assert(!(newDst->IsRegOpnd() && newDst->AsRegOpnd()->IsSymValueFrozen()));

    newDst = newDst->Use(m_func);
    this->m_dst = newDst;

    // If newDst isSingleDef, set instrDef

    StackSym *stackSym;

    if (newDst->IsRegOpnd() && newDst->AsRegOpnd()->m_sym)
    {
        stackSym = newDst->AsRegOpnd()->m_sym->AsStackSym();
    }
    else if (newDst->IsSymOpnd() && newDst->AsSymOpnd()->m_sym->IsStackSym())
    {
        stackSym = newDst->AsSymOpnd()->m_sym->AsStackSym();
    }
    else
    {
        stackSym = nullptr;
    }

    if (stackSym && stackSym->m_isSingleDef)
    {
        if (stackSym->m_instrDef)
        {
            AssertMsg(!stackSym->IsArgSlotSym(), "Arg Slot sym needs to be single def to maintain the StartCall arg links");

            // Multiple defs, clear isSingleDef flag
            stackSym->m_isSingleDef = false;
            stackSym->m_instrDef    = nullptr;
            stackSym->m_isConst     = false;
            stackSym->m_isIntConst  = false;
            stackSym->m_isInt64Const= false;
            stackSym->m_isTaggableIntConst  = false;
            stackSym->m_isNotNumber    = false;
            stackSym->m_isStrConst  = false;
            stackSym->m_isStrEmpty  = false;
            stackSym->m_isFltConst  = false;
        }
        else
        {
            stackSym->m_instrDef = this;
        }
    }

    return newDst;
}